

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chardev.c
# Opt level: O0

LispPTR CHAR_ioctl(LispPTR *args)

{
  int iVar1;
  LispPTR *pLVar2;
  int *piVar3;
  bool bVar4;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  int rval;
  void *data;
  int request;
  int fd;
  LispPTR *args_local;
  
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[3]);
  if ((*args & 0xfff0000) == 0xe0000) {
    local_30 = *args & 0xffff;
  }
  else {
    if ((*args & 0xfff0000) == 0xf0000) {
      local_34 = *args | 0xffff0000;
    }
    else {
      pLVar2 = NativeAligned4FromLAddr(*args);
      local_34 = *pLVar2;
    }
    local_30 = local_34;
  }
  if ((args[1] & 0xfff0000) == 0xe0000) {
    local_38 = args[1] & 0xffff;
  }
  else {
    if ((args[1] & 0xfff0000) == 0xf0000) {
      local_3c = args[1] | 0xffff0000;
    }
    else {
      pLVar2 = NativeAligned4FromLAddr(args[1]);
      local_3c = *pLVar2;
    }
    local_38 = local_3c;
  }
  pLVar2 = NativeAligned4FromLAddr(args[2]);
  iVar1 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar1 == 0) {
    alarm(TIMEOUT_TIME);
    do {
      piVar3 = __errno_location();
      *piVar3 = 0;
      iVar1 = ioctl(local_30,(long)(int)local_38,pLVar2);
      bVar4 = false;
      if (iVar1 == -1) {
        piVar3 = __errno_location();
        bVar4 = *piVar3 == 4;
      }
    } while (bVar4);
    alarm(0);
    if (iVar1 == 0) {
      args_local._4_4_ = 0x4c;
    }
    else {
      piVar3 = __errno_location();
      err_mess("ioctl",*piVar3);
      piVar3 = __errno_location();
      *Lisp_errno = *piVar3;
      args_local._4_4_ = 0;
    }
  }
  else {
    *Lisp_errno = 100;
    args_local._4_4_ = 0;
  }
  return args_local._4_4_;
}

Assistant:

LispPTR CHAR_ioctl(LispPTR *args)
{
#ifndef DOS
  int fd, request;
  void *data;
  int rval;
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[3]);
  fd = LispNumToCInt(args[0]);
  request = LispNumToCInt(args[1]);
  data = NativeAligned4FromLAddr(args[2]);
  ERRSETJMP(NIL);
  TIMEOUT(rval = ioctl(fd, request, data));
  if (rval != 0) {
    err_mess("ioctl", errno);
    *Lisp_errno = errno;
    return (NIL);
  }
  return (ATOM_T);
#endif /* DOS */
}